

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O1

void lore_do_probe(monster *mon)

{
  byte *pbVar1;
  monster_lore *lore;
  monster_race *race;
  
  race = mon->race;
  if (race != (monster_race *)0x0) {
    lore = l_list + race->ridx;
    l_list[race->ridx].all_known = true;
    lore_update(race,lore);
    if (player->upkeep->monster_race == mon->race) {
      pbVar1 = (byte *)((long)&player->upkeep->redraw + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
    return;
  }
  __assert_fail("race",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                ,0x6cb,"struct monster_lore *get_lore(const struct monster_race *)");
}

Assistant:

void lore_do_probe(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	
	lore->all_known = true;
	lore_update(mon->race, lore);

	/* Update monster recall window */
	if (player->upkeep->monster_race == mon->race)
		player->upkeep->redraw |= (PR_MONSTER);
}